

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O1

aiReturn __thiscall
Assimp::Exporter::Export
          (Exporter *this,aiScene *pScene,char *pFormatId,char *pPath,uint pPreprocessing,
          ExportProperties *pProperties)

{
  uint *puVar1;
  ProgressHandler *pPVar2;
  void *pvVar3;
  BaseProcess *pBVar4;
  bool bVar5;
  ExportProperties *list;
  bool bVar6;
  int iVar7;
  uint uVar8;
  Logger *this_00;
  int *piVar9;
  pointer ppBVar10;
  long lVar11;
  long *plVar12;
  ulong uVar13;
  aiMesh **ppaVar14;
  ulong uVar15;
  ulong uVar16;
  pointer pEVar17;
  aiReturn aVar18;
  bool bVar19;
  unique_ptr<aiScene,_std::default_delete<aiScene>_> scenecopy;
  aiScene *scenecopy_tmp;
  ExportProperties emptyProperties;
  bool local_162;
  _Head_base<0UL,_aiScene_*,_false> local_160;
  undefined4 local_158;
  int local_154;
  char *local_150;
  pointer local_148;
  uint local_13c;
  int local_138;
  uint local_134;
  ExportProperties *local_130;
  ExportProperties *local_128;
  aiScene *local_120;
  aiScene *local_118 [2];
  undefined1 local_108 [24];
  undefined1 local_f0 [16];
  aiMesh *local_e0;
  _Base_ptr p_Stack_d8;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  local_c0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
  local_60;
  
  local_13c = pPreprocessing;
  local_130 = pProperties;
  local_108._16_8_ = pPath;
  if (this->pimpl == (ExporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                  ,0x142,
                  "aiReturn Assimp::Exporter::Export(const aiScene *, const char *, const char *, unsigned int, const ExportProperties *)"
                 );
  }
  local_162 = true;
  if ((pScene->mFlags & 8) != 0) {
    local_162 = MakeVerboseFormatProcess::IsVerboseFormat(pScene);
  }
  pPVar2 = this->pimpl->mProgressHandler;
  (*pPVar2->_vptr_ProgressHandler[5])(pPVar2,0,4);
  std::__cxx11::string::_M_replace
            ((ulong)&this->pimpl->mError,0,(char *)(this->pimpl->mError)._M_string_length,0x6d5270);
  pEVar17 = (this->pimpl->mExporters).
            super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar19 = (this->pimpl->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish != pEVar17;
  if (bVar19) {
    local_128 = local_130;
    if (local_130 == (ExportProperties *)0x0) {
      local_128 = (ExportProperties *)local_f0;
    }
    uVar16 = 0;
    local_150 = pFormatId;
    local_120 = pScene;
    do {
      iVar7 = strcmp(pEVar17[uVar16].mDescription.id,pFormatId);
      if (iVar7 == 0) {
        local_118[0] = (aiScene *)0x0;
        local_154 = iVar7;
        SceneCombiner::CopyScene(local_118,local_120,true);
        pPVar2 = this->pimpl->mProgressHandler;
        (*pPVar2->_vptr_ProgressHandler[5])(pPVar2,1,4);
        local_160._M_head_impl = local_118[0];
        pvVar3 = local_120->mPrivate;
        uVar8 = 0xffffffff;
        if ((pvVar3 != (void *)0x0) && (*(char *)((long)pvVar3 + 0xc) == '\0')) {
          uVar8 = ~*(uint *)((long)pvVar3 + 8) | 0x1800004;
        }
        local_148 = pEVar17 + uVar16;
        uVar8 = (local_148->mEnforcePP | local_13c) & uVar8;
        if (local_162 == false) {
          ppBVar10 = (this->pimpl->mPostProcessingSteps).
                     super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((this->pimpl->mPostProcessingSteps).
              super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
              _M_impl.super__Vector_impl_data._M_finish == ppBVar10) {
LAB_002fc17a:
            if ((local_148->mEnforcePP & 2) == 0) goto LAB_002fc185;
          }
          else {
            bVar6 = false;
            uVar13 = 0;
            uVar15 = 1;
            do {
              pBVar4 = ppBVar10[uVar13];
              iVar7 = (*pBVar4->_vptr_BaseProcess[2])(pBVar4,(ulong)uVar8);
              if (((char)iVar7 == '\0') ||
                 (iVar7 = (*pBVar4->_vptr_BaseProcess[3])(pBVar4), (char)iVar7 == '\0')) {
                bVar5 = true;
              }
              else {
                bVar6 = true;
                bVar5 = false;
              }
              if (!bVar5) break;
              ppBVar10 = (this->pimpl->mPostProcessingSteps).
                         super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              bVar5 = uVar15 < (ulong)((long)(this->pimpl->mPostProcessingSteps).
                                             super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppBVar10 >> 3);
              uVar13 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar5);
            pFormatId = local_150;
            if (!bVar6) goto LAB_002fc17a;
          }
          this_00 = DefaultLogger::get();
          Logger::debug(this_00,
                        "export: Scene data not in verbose format, applying MakeVerboseFormat step first"
                       );
          MakeVerboseFormatProcess::MakeVerboseFormatProcess((MakeVerboseFormatProcess *)local_f0);
          MakeVerboseFormatProcess::Execute
                    ((MakeVerboseFormatProcess *)local_f0,local_160._M_head_impl);
          local_158 = (undefined4)
                      CONCAT71((int7)((ulong)local_148 >> 8),(local_148->mEnforcePP & 2) == 0);
          MakeVerboseFormatProcess::~MakeVerboseFormatProcess((MakeVerboseFormatProcess *)local_f0);
        }
        else {
LAB_002fc185:
          local_158 = 0;
        }
        pPVar2 = this->pimpl->mProgressHandler;
        (*pPVar2->_vptr_ProgressHandler[5])(pPVar2,2,4);
        if (uVar8 != 0) {
          FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)local_f0);
          list = local_130;
          bVar6 = FlipWindingOrderProcess::IsActive((FlipWindingOrderProcess *)local_f0,uVar8);
          if (bVar6) {
            FlipWindingOrderProcess::Execute
                      ((FlipWindingOrderProcess *)local_f0,local_160._M_head_impl);
          }
          FlipWindingOrderProcess::~FlipWindingOrderProcess((FlipWindingOrderProcess *)local_f0);
          FlipUVsProcess::FlipUVsProcess((FlipUVsProcess *)local_f0);
          bVar6 = FlipUVsProcess::IsActive((FlipUVsProcess *)local_f0,uVar8);
          if (bVar6) {
            FlipUVsProcess::Execute((FlipUVsProcess *)local_f0,local_160._M_head_impl);
          }
          FlipUVsProcess::~FlipUVsProcess((FlipUVsProcess *)local_f0);
          MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)local_f0);
          bVar6 = MakeLeftHandedProcess::IsActive((MakeLeftHandedProcess *)local_f0,uVar8);
          if (bVar6) {
            MakeLeftHandedProcess::Execute((MakeLeftHandedProcess *)local_f0,local_160._M_head_impl)
            ;
          }
          MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)local_f0);
          if (list == (ExportProperties *)0x0) {
            bVar6 = true;
          }
          else {
            local_138 = 0;
            piVar9 = GetGenericProperty<int>(&list->mIntProperties,"EXPORT_POINT_CLOUDS",&local_138)
            ;
            bVar6 = *piVar9 == 0;
          }
          ppBVar10 = (this->pimpl->mPostProcessingSteps).
                     super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((this->pimpl->mPostProcessingSteps).
              super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
              _M_impl.super__Vector_impl_data._M_finish != ppBVar10) {
            uVar13 = 0;
            uVar15 = 1;
            do {
              pBVar4 = ppBVar10[uVar13];
              iVar7 = (*pBVar4->_vptr_BaseProcess[2])(pBVar4,(ulong)uVar8);
              if (((((char)iVar7 != '\0') &&
                   (lVar11 = __dynamic_cast(pBVar4,&BaseProcess::typeinfo,&FlipUVsProcess::typeinfo,
                                            0), lVar11 == 0)) &&
                  (lVar11 = __dynamic_cast(pBVar4,&BaseProcess::typeinfo,
                                           &FlipWindingOrderProcess::typeinfo,0), lVar11 == 0)) &&
                 ((lVar11 = __dynamic_cast(pBVar4,&BaseProcess::typeinfo,
                                           &MakeLeftHandedProcess::typeinfo,0), lVar11 == 0 &&
                  (lVar11 = __dynamic_cast(pBVar4,&BaseProcess::typeinfo,
                                           &PretransformVertices::typeinfo,0),
                  !(bool)(~bVar6 & lVar11 != 0))))) {
                (*pBVar4->_vptr_BaseProcess[5])(pBVar4,local_160._M_head_impl);
              }
              ppBVar10 = (this->pimpl->mPostProcessingSteps).
                         super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              bVar5 = uVar15 < (ulong)((long)(this->pimpl->mPostProcessingSteps).
                                             super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppBVar10 >> 3);
              uVar13 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar5);
          }
          if (local_160._M_head_impl == (aiScene *)0x0) {
            __assert_fail("nullptr != in",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/ScenePrivate.h"
                          ,0x57,"ScenePrivateData *Assimp::ScenePriv(aiScene *)");
          }
          if ((local_160._M_head_impl)->mPrivate == (void *)0x0) {
            __assert_fail("nullptr != privOut",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                          ,0x1b2,
                          "aiReturn Assimp::Exporter::Export(const aiScene *, const char *, const char *, unsigned int, const ExportProperties *)"
                         );
          }
          puVar1 = (uint *)((long)(local_160._M_head_impl)->mPrivate + 8);
          *puVar1 = *puVar1 | uVar8;
          pFormatId = local_150;
        }
        pPVar2 = this->pimpl->mProgressHandler;
        (*pPVar2->_vptr_ProgressHandler[5])(pPVar2,3,4);
        if ((char)local_158 != '\0') {
          JoinVerticesProcess::JoinVerticesProcess((JoinVerticesProcess *)local_f0);
          JoinVerticesProcess::Execute((JoinVerticesProcess *)local_f0,local_160._M_head_impl);
          JoinVerticesProcess::~JoinVerticesProcess((JoinVerticesProcess *)local_f0);
        }
        ExportProperties::ExportProperties((ExportProperties *)local_f0);
        local_134 = uVar8 >> 1 & 1;
        SetGenericProperty<int>
                  (&local_128->mIntProperties,"bJoinIdenticalVertices",(int *)&local_134);
        (*local_148->mExportFunction)
                  ((char *)local_108._16_8_,
                   (this->pimpl->mIOSystem).
                   super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   local_160._M_head_impl,local_128);
        pPVar2 = this->pimpl->mProgressHandler;
        (*pPVar2->_vptr_ProgressHandler[5])(pPVar2,4,4);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
        ::~_Rb_tree(&local_60);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_90);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
        ::~_Rb_tree(&local_c0);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                     *)local_f0);
        std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::~unique_ptr
                  ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&local_160);
        pScene = (aiScene *)0x0;
        iVar7 = local_154;
      }
      if (iVar7 == 0) break;
      uVar16 = uVar16 + 1;
      pEVar17 = (this->pimpl->mExporters).
                super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar19 = uVar16 < (ulong)(((long)(this->pimpl->mExporters).
                                       super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar17 >>
                                3) * -0x3333333333333333);
    } while (bVar19);
  }
  aVar18 = (aiReturn)pScene;
  if (!bVar19) {
    local_118[0] = (aiScene *)local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,"Found no exporter to handle this file format: ","");
    plVar12 = (long *)std::__cxx11::string::append((char *)local_118);
    ppaVar14 = (aiMesh **)(plVar12 + 2);
    if ((aiMesh **)*plVar12 == ppaVar14) {
      local_e0 = *ppaVar14;
      p_Stack_d8 = (_Base_ptr)plVar12[3];
      local_f0._0_8_ = &local_e0;
    }
    else {
      local_e0 = *ppaVar14;
      local_f0._0_8_ = (aiMesh **)*plVar12;
    }
    local_f0._8_8_ = plVar12[1];
    *plVar12 = (long)ppaVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->pimpl->mError,(string *)local_f0);
    if ((aiMesh **)local_f0._0_8_ != &local_e0) {
      operator_delete((void *)local_f0._0_8_,(ulong)((long)&local_e0->mPrimitiveTypes + 1));
    }
    if (local_118[0] != (aiScene *)local_108) {
      operator_delete(local_118[0],local_108._0_8_ + 1);
    }
    aVar18 = aiReturn_FAILURE;
  }
  return aVar18;
}

Assistant:

aiReturn Exporter::Export( const aiScene* pScene, const char* pFormatId, const char* pPath,
        unsigned int pPreprocessing, const ExportProperties* pProperties) {
    ASSIMP_BEGIN_EXCEPTION_REGION();
	ai_assert(nullptr != pimpl);
    // when they create scenes from scratch, users will likely create them not in verbose
    // format. They will likely not be aware that there is a flag in the scene to indicate
    // this, however. To avoid surprises and bug reports, we check for duplicates in
    // meshes upfront.
    const bool is_verbose_format = !(pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) || MakeVerboseFormatProcess::IsVerboseFormat(pScene);

    pimpl->mProgressHandler->UpdateFileWrite(0, 4);

    pimpl->mError = "";
    for (size_t i = 0; i < pimpl->mExporters.size(); ++i) {
        const Exporter::ExportFormatEntry& exp = pimpl->mExporters[i];
        if (!strcmp(exp.mDescription.id,pFormatId)) {
            try {
                // Always create a full copy of the scene. We might optimize this one day,
                // but for now it is the most pragmatic way.
                aiScene* scenecopy_tmp = nullptr;
                SceneCombiner::CopyScene(&scenecopy_tmp,pScene);

                pimpl->mProgressHandler->UpdateFileWrite(1, 4);

                std::unique_ptr<aiScene> scenecopy(scenecopy_tmp);
                const ScenePrivateData* const priv = ScenePriv(pScene);

                // steps that are not idempotent, i.e. we might need to run them again, usually to get back to the
                // original state before the step was applied first. When checking which steps we don't need
                // to run, those are excluded.
                const unsigned int nonIdempotentSteps = aiProcess_FlipWindingOrder | aiProcess_FlipUVs | aiProcess_MakeLeftHanded;

                // Erase all pp steps that were already applied to this scene
                const unsigned int pp = (exp.mEnforcePP | pPreprocessing) & ~(priv && !priv->mIsCopy
                    ? (priv->mPPStepsApplied & ~nonIdempotentSteps)
                    : 0u);

                // If no extra post-processing was specified, and we obtained this scene from an
                // Assimp importer, apply the reverse steps automatically.
                // TODO: either drop this, or document it. Otherwise it is just a bad surprise.
                //if (!pPreprocessing && priv) {
                //  pp |= (nonIdempotentSteps & priv->mPPStepsApplied);
                //}

                // If the input scene is not in verbose format, but there is at least post-processing step that relies on it,
                // we need to run the MakeVerboseFormat step first.
                bool must_join_again = false;
                if (!is_verbose_format) {
                    bool verbosify = false;
                    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++) {
                        BaseProcess* const p = pimpl->mPostProcessingSteps[a];

                        if (p->IsActive(pp) && p->RequireVerboseFormat()) {
                            verbosify = true;
                            break;
                        }
                    }

                    if (verbosify || (exp.mEnforcePP & aiProcess_JoinIdenticalVertices)) {
                        ASSIMP_LOG_DEBUG("export: Scene data not in verbose format, applying MakeVerboseFormat step first");

                        MakeVerboseFormatProcess proc;
                        proc.Execute(scenecopy.get());

                        if(!(exp.mEnforcePP & aiProcess_JoinIdenticalVertices)) {
                            must_join_again = true;
                        }
                    }
                }

                pimpl->mProgressHandler->UpdateFileWrite(2, 4);

                if (pp) {
                    // the three 'conversion' steps need to be executed first because all other steps rely on the standard data layout
                    {
                        FlipWindingOrderProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    {
                        FlipUVsProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    {
                        MakeLeftHandedProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    bool exportPointCloud(false);
                    if (nullptr != pProperties) {
                        exportPointCloud = pProperties->GetPropertyBool(AI_CONFIG_EXPORT_POINT_CLOUDS);
                    }

                    // dispatch other processes
                    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++) {
                        BaseProcess* const p = pimpl->mPostProcessingSteps[a];

                        if (p->IsActive(pp)
                            && !dynamic_cast<FlipUVsProcess*>(p)
                            && !dynamic_cast<FlipWindingOrderProcess*>(p)
                            && !dynamic_cast<MakeLeftHandedProcess*>(p)) {
                            if (dynamic_cast<PretransformVertices*>(p) && exportPointCloud) {
                                continue;
                            }
                            p->Execute(scenecopy.get());
                        }
                    }
                    ScenePrivateData* const privOut = ScenePriv(scenecopy.get());
                    ai_assert(nullptr != privOut);

                    privOut->mPPStepsApplied |= pp;
                }

                pimpl->mProgressHandler->UpdateFileWrite(3, 4);

                if(must_join_again) {
                    JoinVerticesProcess proc;
                    proc.Execute(scenecopy.get());
                }

                ExportProperties emptyProperties;  // Never pass NULL ExportProperties so Exporters don't have to worry.
                ExportProperties* pProp = pProperties ? (ExportProperties*)pProperties : &emptyProperties;
        		pProp->SetPropertyBool("bJoinIdenticalVertices", pp & aiProcess_JoinIdenticalVertices);
                exp.mExportFunction(pPath,pimpl->mIOSystem.get(),scenecopy.get(), pProp);

                pimpl->mProgressHandler->UpdateFileWrite(4, 4);
            } catch (DeadlyExportError& err) {
                pimpl->mError = err.what();
                return AI_FAILURE;
            }
            return AI_SUCCESS;
        }
    }

    pimpl->mError = std::string("Found no exporter to handle this file format: ") + pFormatId;
    ASSIMP_END_EXCEPTION_REGION(aiReturn);

    return AI_FAILURE;
}